

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask23_16(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  
  uVar1 = *(uint *)(this + 4);
  vpmovsxbd_avx2(ZEXT816(0x302c242018141008));
  auVar6 = vpmovsxbd_avx2(ZEXT816(0x600040002010008));
  auVar11._16_16_ = _DAT_0019b590;
  auVar11._0_16_ = _DAT_0019b590;
  iVar2 = *(int *)(this + 0x38);
  auVar8 = vpinsrd_avx(ZEXT416(*(uint *)(this + 0x1c)),*(undefined4 *)(this + 0x28),1);
  auVar7 = vpsllvd_avx2(auVar8,_DAT_001995d0);
  *in = uVar1 << 0x17 | *(uint *)this;
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x503));
  auVar8 = vpinsrd_avx(ZEXT416(uVar1),*(int *)(this + 0xc) << 5,1);
  auVar10 = vpermi2d_avx512vl(auVar6,auVar9,ZEXT432(uVar1));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x10500));
  auVar6 = vpermd_avx2(ZEXT1632(auVar4),auVar9);
  auVar4 = vpsrlvd_avx2(auVar6._0_16_,_DAT_0019b580);
  auVar8 = vpermi2d_avx512vl(auVar5,auVar7,auVar8);
  auVar6 = vpermq_avx2(ZEXT1632(auVar8),0x44);
  auVar8 = vpinsrd_avx(auVar6._0_16_,auVar9._0_4_ >> 0x12,1);
  uVar1 = *(uint *)(this + 0x34);
  auVar11 = vpermi2d_avx512vl(auVar11,ZEXT1632(auVar4),ZEXT1632(auVar8));
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_001968e0);
  auVar6 = vpor_avx2(auVar6,auVar11);
  auVar6 = vpblendd_avx2(auVar10,auVar6,0x52);
  auVar10 = vpsllvd_avx2(auVar9,_DAT_001a4b40);
  auVar6 = vpor_avx2(auVar10,auVar6);
  *(undefined1 (*) [32])(in + 1) = auVar6;
  in[9] = uVar1 << 0xb | auVar9._28_4_ >> 0xc;
  uVar3 = *(uint *)(this + 0x3c);
  in[10] = uVar3 << 0x19 | iVar2 << 2 | uVar1 >> 0x15;
  in[0xb] = uVar3 >> 7;
  return in + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask23_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (23 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (23 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (23 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (23 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (23 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (23 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (23 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (23 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (23 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (23 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (23 - 16);
  ++in;

  return out + 1;
}